

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleTests.cpp
# Opt level: O0

void __thiscall
ParticleTest_ConstructorDefaultFactor_Test<pica::Particle<(pica::Dimension)1>_>::
ParticleTest_ConstructorDefaultFactor_Test
          (ParticleTest_ConstructorDefaultFactor_Test<pica::Particle<(pica::Dimension)1>_> *this)

{
  ParticleTest<pica::Particle<(pica::Dimension)1>_> *in_RDI;
  
  ParticleTest<pica::Particle<(pica::Dimension)1>_>::ParticleTest(in_RDI);
  (in_RDI->super_BaseParticleFixture<pica::Particle<(pica::Dimension)1>_>).super_BaseFixture.
  super_Test._vptr_Test = (_func_int **)&PTR__ParticleTest_ConstructorDefaultFactor_Test_002ae010;
  return;
}

Assistant:

TYPED_TEST(ParticleTest, ConstructorDefaultFactor)
{
    typedef typename ParticleTest<TypeParam>::Particle ParticleType;
    typedef typename ParticleTest<TypeParam>::PositionType PositionType;
    typedef typename ParticleTest<TypeParam>::MomentumType MomentumType;
    typedef typename ParticleTest<TypeParam>::GammaType GammaType;
    typedef typename ParticleTest<TypeParam>::FactorType FactorType;

    PositionType position = this->getPosition(-12.34, 0.2, 423.12e-2);
    MomentumType momentum(3254.23, -123.324, 1.23e5);
    MassType mass = Constants<MassType>::electronMass();
    ChargeType charge = Constants<ChargeType>::electronCharge();
    ParticleType particle(position, momentum);
    ASSERT_EQ_VECTOR(position, particle.getPosition(), this->dimension);
    ASSERT_EQ_VECTOR(momentum, particle.getMomentum(), this->momentumDimension);
    ASSERT_EQ(mass, particle.getMass());
    ASSERT_EQ(charge, particle.getCharge());
    ASSERT_EQ(static_cast<FactorType>(1.0), particle.getFactor());
}